

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modelling.cpp
# Opt level: O2

void createVars(vec<vec<BoolView>_> *x,int n,int m)

{
  BoolView *pBVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  
  vec<vec<BoolView>_>::growTo(x,n);
  uVar4 = 0;
  uVar3 = 0;
  if (0 < m) {
    uVar3 = (ulong)(uint)m;
  }
  uVar5 = (ulong)(uint)n;
  if (n < 1) {
    uVar5 = uVar4;
  }
  for (; uVar4 != uVar5; uVar4 = uVar4 + 1) {
    vec<BoolView>::growTo(x->data + uVar4,m);
    for (lVar6 = 0; uVar3 * 0x10 != lVar6; lVar6 = lVar6 + 0x10) {
      iVar2 = SAT::newVar(&sat,1,(ChannelInfo)0x0);
      pBVar1 = x->data[uVar4].data;
      *(int *)((long)&pBVar1->v + lVar6) = iVar2;
      (&pBVar1->s)[lVar6] = false;
    }
  }
  return;
}

Assistant:

void createVars(vec<vec<BoolView> >& x, int n, int m) {
	assert(x.size() == 0);
	x.growTo(n);
	for (int i = 0; i < n; i++) {
		x[i].growTo(m);
		for (int j = 0; j < m; j++) {
			x[i][j] = newBoolVar();
		}
	}
}